

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::FiberPool::Impl::Impl(Impl *this,size_t stackSize)

{
  (this->super_Disposer)._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0036ddc0;
  this->stackSize = stackSize;
  this->maxFreelist = 0xffffffffffffffff;
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
  MutexGuarded<>(&this->freelist);
  this->coreLocalFreelists = (CoreLocalFreelist *)0x0;
  return;
}

Assistant:

Impl(size_t stackSize): stackSize(stackSize) {}